

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

uint prvTidytmbstrncpy(tmbstr s1,ctmbstr s2,uint size)

{
  bool bVar1;
  char *local_28;
  tmbstr cp;
  ctmbstr ptStack_18;
  uint size_local;
  ctmbstr s2_local;
  tmbstr s1_local;
  
  cp._4_4_ = size;
  if ((s1 != (tmbstr)0x0) && (local_28 = s1, ptStack_18 = s2, s2 != (ctmbstr)0x0)) {
    while( true ) {
      bVar1 = false;
      if (*ptStack_18 != '\0') {
        cp._4_4_ = cp._4_4_ - 1;
        bVar1 = cp._4_4_ != 0;
      }
      if (!bVar1) break;
      *local_28 = *ptStack_18;
      local_28 = local_28 + 1;
      ptStack_18 = ptStack_18 + 1;
    }
    *local_28 = '\0';
  }
  return cp._4_4_;
}

Assistant:

uint TY_(tmbstrncpy)( tmbstr s1, ctmbstr s2, uint size )
{
    if ( s1 != NULL && s2 != NULL )
    {
        tmbstr cp = s1;
        while ( *s2 && --size )  /* Predecrement: reserve byte */
            *cp++ = *s2++;       /* for NULL terminator. */
        *cp = 0;
    }
    return size;
}